

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultCachedPhoto.h
# Opt level: O0

void __thiscall
TgBot::InlineQueryResultCachedPhoto::InlineQueryResultCachedPhoto
          (InlineQueryResultCachedPhoto *this)

{
  InlineQueryResultCachedPhoto *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultCachedPhoto_0051adc0;
  std::__cxx11::string::string((string *)&this->photoFileId);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  return;
}

Assistant:

InlineQueryResultCachedPhoto() {
        this->type = TYPE;
    }